

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

char * nifti_find_file_extension(char *name)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *__format;
  uint uVar4;
  char *pcVar5;
  char extcopy [8];
  char extimg [8];
  char exthdr [8];
  char extnii [8];
  char extnia [8];
  char local_7c [8];
  int local_74;
  char local_70 [8];
  undefined8 local_68;
  char local_60 [8];
  char *local_58 [4];
  undefined8 local_38;
  
  local_58[0] = local_60;
  builtin_strncpy(local_60,".nii",5);
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  local_58[1] = (char *)&local_68;
  local_68 = 0x7264682e;
  local_58[2] = local_70;
  builtin_strncpy(local_70,".img",5);
  local_70[5] = '\0';
  local_70[6] = '\0';
  local_70[7] = '\0';
  local_58[3] = (char *)&local_38;
  local_38 = 0x61696e2e;
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    uVar4 = (uint)sVar2;
    if (3 < (int)uVar4) {
      pcVar5 = name + ((ulong)(uVar4 & 0x7fffffff) - 4);
      strcpy(local_7c,pcVar5);
      local_74 = g_opts_2;
      if (g_opts_2 != 0) {
        make_lowercase(local_7c);
      }
      lVar3 = 0;
      do {
        if ((local_58[lVar3] != (char *)0x0) &&
           (iVar1 = strcmp(local_7c,local_58[lVar3]), iVar1 == 0)) {
          iVar1 = is_mixedcase(pcVar5);
          if (iVar1 != 0) {
            fprintf(_stderr,"** mixed case extension \'%s\' is not valid\n",pcVar5);
            return (char *)0x0;
          }
          return pcVar5;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      if (6 < (int)uVar4) {
        pcVar5 = name + ((ulong)(uVar4 & 0x7fffffff) - 7);
        strcpy(local_7c,pcVar5);
        if (local_74 != 0) {
          make_lowercase(local_7c);
        }
        sVar2 = strlen(local_60);
        *(undefined4 *)((long)local_58 + (sVar2 - 8)) = 0x7a672e;
        sVar2 = strlen((char *)&local_68);
        *(undefined4 *)((long)&local_68 + sVar2) = 0x7a672e;
        sVar2 = strlen(local_70);
        builtin_strncpy(local_70 + sVar2,".gz",4);
        lVar3 = 0;
        do {
          if ((local_58[lVar3] != (char *)0x0) &&
             (iVar1 = strcmp(local_7c,local_58[lVar3]), iVar1 == 0)) {
            iVar1 = is_mixedcase(pcVar5);
            if (iVar1 == 0) {
              return pcVar5;
            }
            __format = "** mixed case extension \'%s\' is not valid\n";
            goto LAB_00111d51;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        if (1 < g_opts_0) {
          __format = "** find_file_ext: failed for name \'%s\'\n";
          pcVar5 = name;
LAB_00111d51:
          fprintf(_stderr,__format,pcVar5);
          return (char *)0x0;
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char * nifti_find_file_extension( const char * name )
{
   const char * ext;
   char extcopy[8];
   int    len;
   char   extnii[8] = ".nii";   /* modifiable, for possible uppercase */
   char   exthdr[8] = ".hdr";   /* (leave space for .gz) */
   char   extimg[8] = ".img";
   char   extnia[8] = ".nia";
   char   extgz[4]  = ".gz";
   char * elist[4]  = { NULL, NULL, NULL, NULL};

   /* stupid compiler... */
   elist[0] = extnii; elist[1] = exthdr; elist[2] = extimg; elist[3] = extnia;

   if ( ! name ) return NULL;

   len = (int)strlen(name);
   if ( len < 4 ) return NULL;

   ext = name + len - 4;

   /* make manipulation copy, and possibly convert to lowercase */
   strcpy(extcopy, ext);
   if( g_opts.allow_upper_fext ) make_lowercase(extcopy);

   /* if it look like a basic extension, fail or return it */
   if( compare_strlist(extcopy, elist, 4) >= 0 ) {
      if( is_mixedcase(ext) ) {
         fprintf(stderr,"** mixed case extension '%s' is not valid\n", ext);
         return NULL;
      }
      else return (char *)ext; /* Cast away the constness of the input parameter */
   }

#ifdef HAVE_ZLIB
   if ( len < 7 ) return NULL;

   ext = name + len - 7;

   /* make manipulation copy, and possibly convert to lowercase */
   strcpy(extcopy, ext);
   if( g_opts.allow_upper_fext ) make_lowercase(extcopy);

   /* go after .gz extensions using the modifiable strings */
   strcat(elist[0], extgz); strcat(elist[1], extgz); strcat(elist[2], extgz);

   if( compare_strlist(extcopy, elist, 3) >= 0 ) {
      if( is_mixedcase(ext) ) {
         fprintf(stderr,"** mixed case extension '%s' is not valid\n", ext);
         return NULL;
      }
      else return (char *)ext; /* Cast away the constness of the input parameter */
   }

#endif

   if( g_opts.debug > 1 )
      fprintf(stderr,"** find_file_ext: failed for name '%s'\n", name);

   return NULL;
}